

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

void __thiscall c4::yml::Tree::resolve_tags(Tree *this)

{
  bool bVar1;
  size_t sVar2;
  Tree *in_RDI;
  size_t needed_size;
  Tree *in_stack_00000040;
  size_t in_stack_00000058;
  Tree *in_stack_00000060;
  size_t in_stack_00000068;
  Tree *in_stack_00000070;
  
  bVar1 = empty(in_RDI);
  if ((!bVar1) && (sVar2 = num_tag_directives(in_RDI), sVar2 != 0)) {
    root_id(in_stack_00000040);
    sVar2 = anon_unknown_0::_count_resolved_tags_size(in_stack_00000060,in_stack_00000058);
    if (sVar2 != 0) {
      arena_size(in_RDI);
      reserve_arena(in_stack_00000060,in_stack_00000058);
    }
    root_id(in_stack_00000040);
    anon_unknown_0::_resolve_tags(in_stack_00000070,in_stack_00000068);
  }
  return;
}

Assistant:

void Tree::resolve_tags()
{
    if(empty())
        return;
    if(num_tag_directives() == 0)
        return;
    size_t needed_size = _count_resolved_tags_size(this, root_id());
    if(needed_size)
        reserve_arena(arena_size() + needed_size);
    _resolve_tags(this, root_id());
}